

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

int Gia_ManQuantExist2(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  Gia_Man_t *pGVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int c;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *pVVar5;
  int local_a4;
  Vec_Int_t *t;
  int nAndsNew;
  int nAndsOld;
  int nVarsQua;
  int pLits [2];
  int OutLit;
  int Lit;
  int Entry;
  int n;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCis;
  Vec_Int_t *vOuts2;
  Vec_Int_t *vOuts;
  Gia_Man_t *pNew;
  void *pData_local;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  Gia_Man_t *pGStack_18;
  int iLit_local;
  Gia_Man_t *p0_local;
  
  pNew = (Gia_Man_t *)pData;
  pData_local = pFuncCiToKeep;
  pFuncCiToKeep_local._4_4_ = iLit;
  pGStack_18 = p0;
  iVar3 = Abc_Lit2Var(iLit);
  pObj_00 = Gia_ManObj(p0,iVar3);
  pLits[0] = -1;
  if (pFuncCiToKeep_local._4_4_ < 2) {
    p0_local._4_4_ = pFuncCiToKeep_local._4_4_;
  }
  else {
    iVar3 = Gia_ObjIsCi(pObj_00);
    pvVar2 = pData_local;
    pGVar1 = pNew;
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsAnd(pObj_00);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                      ,300,"int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)")
        ;
      }
      vOuts = (Vec_Int_t *)
              Gia_ManQuantDupConeSupp
                        (pGStack_18,pFuncCiToKeep_local._4_4_,(_func_int_void_ptr_int *)pData_local,
                         pNew,(Vec_Int_t **)&pObj,pLits);
      if (((Gia_Man_t *)vOuts)->iSuppPi == 0) {
        Gia_ManStop((Gia_Man_t *)vOuts);
        Vec_IntFree((Vec_Int_t *)pObj);
        p0_local._4_4_ = pFuncCiToKeep_local._4_4_;
      }
      else {
        if ((((Gia_Man_t *)vOuts)->iSuppPi < 1) ||
           (((Gia_Man_t *)vOuts)->nSuppWords * 0x40 < ((Gia_Man_t *)vOuts)->iSuppPi)) {
          __assert_fail("pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x134,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        vOuts2 = Vec_IntAlloc(100);
        vCis = Vec_IntAlloc(100);
        if (pLits[0] < 2) {
          __assert_fail("OutLit > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x137,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        Vec_IntPush(vOuts2,pLits[0]);
        Gia_ManAndNum((Gia_Man_t *)vOuts);
        while (iVar3 = vOuts[0x3b].nCap + -1, vOuts[0x3b].nCap = iVar3, -1 < iVar3) {
          iVar3 = Vec_IntEntry(vOuts2,0);
          Abc_Lit2Var(iVar3);
          iVar3 = Vec_IntSize(vOuts + 0x3c);
          iVar4 = Gia_ManObjNum((Gia_Man_t *)vOuts);
          if (SBORROW4(iVar3,iVar4 * 2) != iVar3 + iVar4 * -2 < 0) {
            pVVar5 = vOuts + 0x3c;
            iVar3 = Gia_ManObjNum((Gia_Man_t *)vOuts);
            Vec_IntFillExtra(pVVar5,iVar3 << 1,-1);
          }
          iVar3 = Vec_IntSize(vOuts2);
          if (iVar3 < 1) {
            __assert_fail("Vec_IntSize(vOuts) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                          ,0x142,
                          "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
          }
          Vec_IntClear(vCis);
          Gia_ManIncrementTravId((Gia_Man_t *)vOuts);
          for (Entry = 0; iVar3 = Vec_IntSize(vOuts2), Entry < iVar3; Entry = Entry + 1) {
            iVar3 = Vec_IntEntry(vOuts2,Entry);
            pVVar5 = vOuts;
            iVar4 = Abc_Lit2Var(iVar3);
            Gia_ManQuantExist_rec((Gia_Man_t *)pVVar5,iVar4,&nAndsOld);
            for (Lit = 0; Lit < 2; Lit = Lit + 1) {
              iVar4 = (&nAndsOld)[Lit];
              c = Abc_LitIsCompl(iVar3);
              pLits[1] = Abc_LitNotCond(iVar4,c);
              if (pLits[1] != 0) {
                if (pLits[1] == 1) {
                  Vec_IntFree(vOuts2);
                  Vec_IntFree(vCis);
                  Gia_ManStop((Gia_Man_t *)vOuts);
                  Vec_IntFree((Vec_Int_t *)pObj);
                  return 1;
                }
                Vec_IntPushUnique(vCis,pLits[1]);
              }
            }
          }
          Vec_IntClear(vOuts2);
          pVVar5 = vCis;
          vCis = vOuts2;
          vOuts2 = pVVar5;
        }
        iVar3 = Vec_IntSize(vOuts2);
        if (iVar3 < 1) {
          __assert_fail("Vec_IntSize(vOuts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x15d,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        for (Entry = 0; iVar3 = Vec_IntSize(vOuts2), Entry < iVar3; Entry = Entry + 1) {
          iVar3 = Vec_IntEntry(vOuts2,Entry);
          pVVar5 = vOuts2;
          iVar3 = Abc_LitNot(iVar3);
          Vec_IntWriteEntry(pVVar5,Entry,iVar3);
        }
        pLits[0] = Gia_ManHashAndMulti((Gia_Man_t *)vOuts,vOuts2);
        pLits[0] = Abc_LitNot(pLits[0]);
        Vec_IntFree(vOuts2);
        Vec_IntFree(vCis);
        Gia_ManAppendCo((Gia_Man_t *)vOuts,pLits[0]);
        Gia_ManAndNum(pGStack_18);
        pLits[1] = Gia_ManDupConeBack(pGStack_18,(Gia_Man_t *)vOuts,(Vec_Int_t *)pObj);
        Gia_ManAndNum(pGStack_18);
        Gia_ManStop((Gia_Man_t *)vOuts);
        Vec_IntFree((Vec_Int_t *)pObj);
        p0_local._4_4_ = pLits[1];
      }
    }
    else {
      iVar3 = Gia_ObjCioId(pObj_00);
      iVar3 = (*(code *)pvVar2)(pGVar1,iVar3);
      if (iVar3 == 0) {
        local_a4 = 1;
      }
      else {
        local_a4 = pFuncCiToKeep_local._4_4_;
      }
      p0_local._4_4_ = local_a4;
    }
  }
  return p0_local._4_4_;
}

Assistant:

int Gia_ManQuantExist2( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
//    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vOuts, * vOuts2, * vCis; 
    Gia_Obj_t * pObj = Gia_ManObj( p0, Abc_Lit2Var(iLit) );
    int i, n, Entry, Lit, OutLit = -1, pLits[2], nVarsQua, nAndsOld, nAndsNew; 
    if ( iLit < 2 ) return iLit;
    if ( Gia_ObjIsCi(pObj) ) return pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) ? iLit : 1;
    assert( Gia_ObjIsAnd(pObj) );
    pNew = Gia_ManQuantDupConeSupp( p0, iLit, pFuncCiToKeep, pData, &vCis, &OutLit );
    if ( pNew->iSuppPi == 0 )
    {
        Gia_ManStop( pNew );
        Vec_IntFree( vCis );
        return iLit;
    }
    assert( pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords );
    vOuts = Vec_IntAlloc( 100 );
    vOuts2 = Vec_IntAlloc( 100 );
    assert( OutLit > 1 );
    Vec_IntPush( vOuts, OutLit );
    nVarsQua = pNew->iSuppPi;
    nAndsOld = Gia_ManAndNum(pNew);
    while ( --pNew->iSuppPi >= 0 )
    {
        Entry = Abc_Lit2Var( Vec_IntEntry(vOuts, 0) );
//        printf( "Quantifying input %d with %d affected nodes (out of %d):\n", 
//            pNew->iSuppPi, Gia_ManQuantCountUsed(pNew,Entry), Gia_ManAndNum(pNew) );
        if ( Vec_IntSize(&pNew->vCopiesTwo) < 2*Gia_ManObjNum(pNew) )
            Vec_IntFillExtra( &pNew->vCopiesTwo, 2*Gia_ManObjNum(pNew), -1 );
        assert( Vec_IntSize(vOuts) > 0 );
        Vec_IntClear( vOuts2 );
        Gia_ManIncrementTravId( pNew );
        Vec_IntForEachEntry( vOuts, Entry, i )
        {
            Gia_ManQuantExist_rec( pNew, Abc_Lit2Var(Entry), pLits );
            for ( n = 0; n < 2; n++ )
            {
                Lit = Abc_LitNotCond( pLits[n], Abc_LitIsCompl(Entry) );
                if ( Lit == 0 )
                    continue;
                if ( Lit == 1 )
                {
                    Vec_IntFree( vOuts );
                    Vec_IntFree( vOuts2 );
                    Gia_ManStop( pNew );
                    Vec_IntFree( vCis );
                    return 1;
                }
                Vec_IntPushUnique( vOuts2, Lit );
            }
        }
        Vec_IntClear( vOuts );
        ABC_SWAP( Vec_Int_t *, vOuts, vOuts2 );
    }
//    printf( "\n" );
    //printf( "The number of diff cofactors = %d.\n", Vec_IntSize(vOuts) );
    assert( Vec_IntSize(vOuts) > 0 );
    Vec_IntForEachEntry( vOuts, Entry, i )
        Vec_IntWriteEntry( vOuts, i, Abc_LitNot(Entry) );
    OutLit = Gia_ManHashAndMulti( pNew, vOuts );
    OutLit = Abc_LitNot( OutLit );
    Vec_IntFree( vOuts );
    Vec_IntFree( vOuts2 );
    // transfer back
    Gia_ManAppendCo( pNew, OutLit );
    nAndsNew = Gia_ManAndNum(p0);
    Lit = Gia_ManDupConeBack( p0, pNew, vCis );
    nAndsNew = Gia_ManAndNum(p0) - nAndsNew;
    Gia_ManStop( pNew );
    // report the result
//    printf( "Performed quantification with %6d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d new nodes. \n", 
//        nAndsOld, Vec_IntSize(vCis) - nVarsQua, nVarsQua, nAndsNew );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vCis );
    return Lit;
}